

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Flate.cc
# Opt level: O0

ssize_t __thiscall Pl_Flate::write(Pl_Flate *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  pointer pMVar2;
  logic_error *this_00;
  pointer pbVar3;
  uchar *data;
  int flush;
  undefined4 in_register_00000034;
  uchar *local_80;
  size_t bytes;
  uchar *buf;
  size_t bytes_left;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  uchar *local_20;
  size_t len_local;
  uchar *data_local;
  Pl_Flate *this_local;
  
  len_local = CONCAT44(in_register_00000034,__fd);
  local_20 = (uchar *)__buf;
  data_local = (uchar *)this;
  pMVar2 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::operator->
                     (&this->m);
  bVar1 = std::operator==(&pMVar2->outbuf,(nullptr_t)0x0);
  if (!bVar1) {
    pMVar2 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::operator->
                       (&this->m);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&pMVar2->zopfli_buf);
    if (bVar1) {
      pMVar2 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::
               operator->(&this->m);
      pbVar3 = std::
               unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->(&pMVar2->zopfli_buf);
      data = (uchar *)std::__cxx11::string::append((char *)pbVar3,len_local);
    }
    else {
      data = (uchar *)len_local;
      for (buf = local_20; buf != (uchar *)0x0; buf = buf + -(long)local_80) {
        if (buf < (uchar *)0x40000000) {
          local_80 = buf;
        }
        else {
          local_80 = (uchar *)0x40000000;
        }
        pMVar2 = std::unique_ptr<Pl_Flate::Members,_std::default_delete<Pl_Flate::Members>_>::
                 operator->(&this->m);
        flush = 0;
        if (pMVar2->action == a_inflate) {
          flush = 2;
        }
        handleData(this,data,(size_t)local_80,flush);
        data = local_80 + (long)data;
      }
    }
    return (ssize_t)data;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_40,&(this->super_Pipeline).identifier,
                 ": Pl_Flate: write() called after finish() called");
  std::logic_error::logic_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
Pl_Flate::write(unsigned char const* data, size_t len)
{
    if (m->outbuf == nullptr) {
        throw std::logic_error(
            this->identifier + ": Pl_Flate: write() called after finish() called");
    }
    if (m->zopfli_buf) {
        m->zopfli_buf->append(reinterpret_cast<char const*>(data), len);
        return;
    }

    // Write in chunks in case len is too big to fit in an int. Assume int is at least 32 bits.
    static size_t const max_bytes = 1 << 30;
    size_t bytes_left = len;
    unsigned char const* buf = data;
    while (bytes_left > 0) {
        size_t bytes = (bytes_left >= max_bytes ? max_bytes : bytes_left);
        handleData(buf, bytes, (m->action == a_inflate ? Z_SYNC_FLUSH : Z_NO_FLUSH));
        bytes_left -= bytes;
        buf += bytes;
    }
}